

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode process_trailer(connectdata *conn,zlib_params *zp)

{
  z_stream *z_00;
  uint local_2c;
  CURLcode local_24;
  uInt len;
  CURLcode result;
  z_stream *z;
  zlib_params *zp_local;
  connectdata *conn_local;
  
  z_00 = &zp->z;
  local_24 = CURLE_OK;
  if ((zp->z).avail_in < zp->trailerlen) {
    local_2c = (zp->z).avail_in;
  }
  else {
    local_2c = zp->trailerlen;
  }
  zp->trailerlen = zp->trailerlen - local_2c;
  (zp->z).avail_in = (zp->z).avail_in - local_2c;
  z_00->next_in = z_00->next_in + local_2c;
  if ((zp->z).avail_in != 0) {
    local_24 = CURLE_WRITE_ERROR;
  }
  if ((local_24 == CURLE_OK) && (zp->trailerlen != 0)) {
    zp->zlib_init = ZLIB_GZIP_TRAILER;
  }
  else {
    local_24 = exit_zlib(conn,z_00,&zp->zlib_init,local_24);
  }
  return local_24;
}

Assistant:

static CURLcode process_trailer(struct connectdata *conn, zlib_params *zp)
{
  z_stream *z = &zp->z;
  CURLcode result = CURLE_OK;
  uInt len = z->avail_in < zp->trailerlen? z->avail_in: zp->trailerlen;

  /* Consume expected trailer bytes. Terminate stream if exhausted.
     Issue an error if unexpected bytes follow. */

  zp->trailerlen -= len;
  z->avail_in -= len;
  z->next_in += len;
  if(z->avail_in)
    result = CURLE_WRITE_ERROR;
  if(result || !zp->trailerlen)
    result = exit_zlib(conn, z, &zp->zlib_init, result);
  else {
    /* Only occurs for gzip with zlib < 1.2.0.4. */
    zp->zlib_init = ZLIB_GZIP_TRAILER;
  }
  return result;
}